

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecyclerSweep.h
# Opt level: O0

void __thiscall
Memory::RecyclerSweep::
QueueEmptyHeapBlock<Memory::SmallNormalHeapBlockT<SmallAllocationBlockAttributes>>
          (RecyclerSweep *this,
          HeapBucketT<Memory::SmallNormalHeapBlockT<SmallAllocationBlockAttributes>_> *heapBucket,
          SmallNormalHeapBlockT<SmallAllocationBlockAttributes> *heapBlock)

{
  SmallNormalHeapBlockT<SmallAllocationBlockAttributes> *next;
  code *pcVar1;
  bool bVar2;
  BucketData<Memory::SmallNormalHeapBlockT<SmallAllocationBlockAttributes>_> *pBVar3;
  undefined4 *puVar4;
  SmallNormalHeapBlockT<SmallAllocationBlockAttributes> *list;
  BucketData<Memory::SmallNormalHeapBlockT<SmallAllocationBlockAttributes>_> *bucketData;
  SmallNormalHeapBlockT<SmallAllocationBlockAttributes> *heapBlock_local;
  HeapBucketT<Memory::SmallNormalHeapBlockT<SmallAllocationBlockAttributes>_> *heapBucket_local;
  RecyclerSweep *this_local;
  
  if ((DAT_01eca380 & 1) != 0) {
    pBVar3 = GetBucketData<Memory::SmallNormalHeapBlockT<SmallAllocationBlockAttributes>>
                       (this,heapBucket);
    if ((HeapBucketT<Memory::SmallNormalHeapBlockT<SmallAllocationBlockAttributes>_> *)
        (heapBlock->super_SmallHeapBlockT<SmallAllocationBlockAttributes>).heapBucket != heapBucket)
    {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/RecyclerSweep.h"
                         ,0xa9,"(heapBlock->heapBucket == heapBucket)",
                         "heapBlock->heapBucket == heapBucket");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    SmallHeapBlockT<SmallAllocationBlockAttributes>::BackgroundReleasePagesSweep
              (&heapBlock->super_SmallHeapBlockT<SmallAllocationBlockAttributes>,this->recycler);
    next = pBVar3->pendingEmptyBlockList;
    if (next == (SmallNormalHeapBlockT<SmallAllocationBlockAttributes> *)0x0) {
      if (pBVar3->pendingEmptyBlockListTail !=
          (SmallNormalHeapBlockT<SmallAllocationBlockAttributes> *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/RecyclerSweep.h"
                           ,0xb0,"(bucketData.pendingEmptyBlockListTail == nullptr)",
                           "bucketData.pendingEmptyBlockListTail == nullptr");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 0;
      }
      pBVar3->pendingEmptyBlockListTail = heapBlock;
      this->hasPendingEmptyBlocks = true;
    }
    SmallNormalHeapBlockT<SmallAllocationBlockAttributes>::SetNextBlock(heapBlock,next);
    pBVar3->pendingEmptyBlockList = heapBlock;
  }
  return;
}

Assistant:

void
RecyclerSweep::QueueEmptyHeapBlock(HeapBucketT<TBlockType> const *heapBucket, TBlockType * heapBlock)
{
#if ENABLE_BACKGROUND_PAGE_FREEING
    if (CONFIG_FLAG(EnableBGFreeZero))
    {
        auto& bucketData = this->GetBucketData(heapBucket);
        Assert(heapBlock->heapBucket == heapBucket);

        heapBlock->BackgroundReleasePagesSweep(recycler);

        TBlockType * list = bucketData.pendingEmptyBlockList;
        if (list == nullptr)
        {
            Assert(bucketData.pendingEmptyBlockListTail == nullptr);
            bucketData.pendingEmptyBlockListTail = heapBlock;
            this->hasPendingEmptyBlocks = true;
        }
        heapBlock->SetNextBlock(list);
        bucketData.pendingEmptyBlockList = heapBlock;
    }
#endif
}